

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_copy_mbs_len(archive_mstring *aes,char *mbs,size_t len)

{
  size_t len_local;
  char *mbs_local;
  archive_mstring *aes_local;
  
  if (mbs == (char *)0x0) {
    aes->aes_set = L'\0';
  }
  else {
    aes->aes_set = L'\x01';
    (aes->aes_mbs).length = 0;
    archive_strncat(&aes->aes_mbs,mbs,len);
    (aes->aes_utf8).length = 0;
    (aes->aes_wcs).length = 0;
  }
  return L'\0';
}

Assistant:

int
archive_mstring_copy_mbs_len(struct archive_mstring *aes, const char *mbs,
    size_t len)
{
	if (mbs == NULL) {
		aes->aes_set = 0;
		return (0);
	}
	aes->aes_set = AES_SET_MBS; /* Only MBS form is set now. */
	archive_strncpy(&(aes->aes_mbs), mbs, len);
	archive_string_empty(&(aes->aes_utf8));
	archive_wstring_empty(&(aes->aes_wcs));
	return (0);
}